

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDistribution.cpp
# Opt level: O1

double __thiscall chrono::ChDiscreteDistribution::GetRandom(ChDiscreteDistribution *this)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = ChRandom();
  uVar2 = (this->x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (0 < (long)uVar2) {
    uVar3 = (this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    uVar4 = 0;
    dVar6 = 0.0;
    do {
      if ((~((long)uVar3 >> 0x3f) & uVar3) == uVar4) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      dVar1 = (this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
              .m_data[uVar4];
      if ((dVar6 < dVar5) && (dVar5 <= dVar1)) {
        return (this->x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[uVar4];
      }
      uVar4 = uVar4 + 1;
      dVar6 = dVar1;
    } while (uVar2 != uVar4);
  }
  return 0.0;
}

Assistant:

double ChDiscreteDistribution::GetRandom() {
    double rand = ChRandom();
    double lastval = 0;
    for (int i = 0; i < x.size(); i++) {
        if ((rand <= cdf_y(i)) && (rand > lastval)) {
            return x(i);
        }
        lastval = cdf_y(i);
    }
    return 0;
}